

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::createInstance
          (ShaderOperatorCase *this,Context *context)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  ShaderRenderCaseInstance *this_00;
  long lVar5;
  float *pfVar6;
  int rowNdx;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  BaseAttributeType type;
  ulong uVar11;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  ulong local_d8;
  long lStack_d0;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *local_c0;
  _func_int **local_b8;
  Context *pCStack_b0;
  undefined8 local_a8;
  SparseContext *pSStack_a0;
  undefined8 local_98;
  Allocator *pAStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Mat4 attribMatrix;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x250);
  local_b8 = *(_func_int ***)&this->m_spec;
  pCStack_b0 = *(Context **)&(this->m_spec).referenceScale;
  local_a8._0_4_ = (this->m_spec).precision;
  local_a8._4_4_ = (this->m_spec).output;
  pSStack_a0 = *(SparseContext **)&(this->m_spec).numInputs;
  local_98._0_4_ = (this->m_spec).inputs[0].rangeMin;
  local_98._4_4_ = (this->m_spec).inputs[0].rangeMax;
  pAStack_90 = *(Allocator **)((this->m_spec).inputs + 1);
  local_88 = *(undefined8 *)&(this->m_spec).inputs[1].rangeMax;
  uStack_80._0_4_ = (this->m_spec).inputs[2].rangeMin;
  uStack_80._4_4_ = (this->m_spec).inputs[2].rangeMax;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,(this->super_ShaderRenderCase).m_isVertexCase,
             (this->super_ShaderRenderCase).m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderRenderCase).m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00cf7700;
  this_00[1].m_imageBackingMode = (undefined4)local_a8;
  this_00[1].m_quadGridSize = local_a8._4_4_;
  this_00[1].m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = pSStack_a0;
  this_00[1].super_TestInstance._vptr_TestInstance = local_b8;
  this_00[1].super_TestInstance.m_context = pCStack_b0;
  *(undefined8 *)
   &this_00[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.field_0x8 = local_98;
  this_00[1].m_memAlloc = pAStack_90;
  *(undefined8 *)this_00[1].m_clearColor.m_data = local_88;
  *(undefined8 *)(this_00[1].m_clearColor.m_data + 2) = uStack_80;
  local_c0 = &this_00->m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (local_c0,(long)*(int *)&this_00[1].m_sparseContext.
                                     super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                                     .m_data.ptr);
  iVar4 = *(int *)&this_00[1].m_sparseContext.
                   super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                   .m_data.ptr;
  if (0 < iVar4) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      fVar1 = *(float *)((long)(&this_00[1].m_clearColor + -1) + uVar11 * 0xc);
      fVar2 = this_00[1].m_clearColor.m_data[uVar11 * 3 + -3];
      attribMatrix.m_data.m_data[3].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[3] = 0.0;
      lVar5 = 0;
      lVar8 = 0;
      pfVar6 = (float *)&attribMatrix;
      do {
        lVar9 = 0;
        do {
          uVar12 = 0x3f800000;
          if (lVar5 != lVar9) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar6 + lVar9) = uVar12;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x40);
        lVar8 = lVar8 + 1;
        pfVar6 = pfVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar8 != 4);
      fVar13 = fVar2 - fVar1;
      lVar5 = 0;
      pfVar6 = (float *)&attribMatrix;
      do {
        type = (BaseAttributeType)uVar11;
        uVar7 = (int)lVar5 + type;
        uVar3 = (int)lVar5 + 3 + type;
        if (-1 < (int)uVar7) {
          uVar3 = uVar7;
        }
        local_d8 = 0;
        lStack_d0 = 0;
        fVar14 = fVar1;
        switch(uVar7 - (uVar3 & 0xfffffffc)) {
        case 0:
          local_d8 = (ulong)(uint)fVar13;
          break;
        case 1:
          local_d8 = (ulong)(uint)fVar13 << 0x20;
          break;
        case 2:
          local_d8 = (ulong)(uint)fVar13 ^ 0x80000000;
          fVar14 = fVar2;
          break;
        case 3:
          local_d8 = (ulong)(uint)fVar13 << 0x20 ^ 0x8000000000000000;
          fVar14 = fVar2;
          break;
        default:
          goto switchD_005cc5c9_default;
        }
        lStack_d0 = (ulong)(uint)fVar14 << 0x20;
switchD_005cc5c9_default:
        lVar8 = 0;
        do {
          pfVar6[lVar8] = *(float *)((long)&local_d8 + lVar8);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        lVar5 = lVar5 + 1;
        pfVar6 = pfVar6 + 1;
      } while (lVar5 != 4);
      lVar5 = (long)(((local_c0->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data + lVar10
      ;
      lVar8 = 0;
      pfVar6 = (float *)&attribMatrix;
      do {
        lVar9 = 0;
        do {
          *(undefined4 *)(lVar5 + lVar9) = *(undefined4 *)((long)pfVar6 + lVar9);
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x40);
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + 4;
        pfVar6 = pfVar6 + 1;
      } while (lVar8 != 4);
      if (uVar11 < 4) {
        ShaderRenderCaseInstance::useAttribute(this_00,type | MAT2,type);
        iVar4 = *(int *)&this_00[1].m_sparseContext.
                         super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                         .m_data.ptr;
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x40;
    } while ((long)uVar11 < (long)iVar4);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ShaderOperatorCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new ShaderOperatorCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_spec);
}